

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void av1_fill_lr_rates(ModeCosts *mode_costs,FRAME_CONTEXT *fc)

{
  av1_cost_tokens_from_cdf
            (mode_costs->switchable_restore_cost,fc->switchable_restore_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(mode_costs->wiener_restore_cost,fc->wiener_restore_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(mode_costs->sgrproj_restore_cost,fc->sgrproj_restore_cdf,(int *)0x0);
  return;
}

Assistant:

void av1_fill_lr_rates(ModeCosts *mode_costs, FRAME_CONTEXT *fc) {
  av1_cost_tokens_from_cdf(mode_costs->switchable_restore_cost,
                           fc->switchable_restore_cdf, NULL);
  av1_cost_tokens_from_cdf(mode_costs->wiener_restore_cost,
                           fc->wiener_restore_cdf, NULL);
  av1_cost_tokens_from_cdf(mode_costs->sgrproj_restore_cost,
                           fc->sgrproj_restore_cdf, NULL);
}